

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (buf == (xmlBufPtr)0x0) {
    return 0;
  }
  sVar2 = 0;
  if ((len != 0) && ((buf->flags & 3) == 0)) {
    uVar1 = (ulong)buf->compat_size;
    if ((uVar1 < 0x7fffffff) && (buf->size != uVar1)) {
      buf->size = uVar1;
    }
    uVar1 = (ulong)buf->compat_use;
    if ((uVar1 < 0x7fffffff) && (buf->use != uVar1)) {
      buf->use = uVar1;
    }
    uVar1 = buf->use - len;
    if (buf->use < len) {
      return 0;
    }
    buf->use = uVar1;
    buf->content = buf->content + len;
    uVar3 = buf->size - len;
    buf->size = uVar3;
    if (0x7ffffffe < uVar3) {
      uVar3 = 0x7fffffff;
    }
    buf->compat_size = (uint)uVar3;
    uVar3 = 0x7fffffff;
    if (uVar1 < 0x7fffffff) {
      uVar3 = uVar1;
    }
    buf->compat_use = (uint)uVar3;
    sVar2 = len;
  }
  return sVar2;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)))
        return(0);
    if (len == 0)
        return(0);
    CHECK_COMPAT(buf)

    if (len > buf->use)
        return(0);

    buf->use -= len;
    buf->content += len;
    buf->size -= len;

    UPDATE_COMPAT(buf)
    return(len);
}